

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XMLDateTime.cpp
# Opt level: O1

XMLCh * __thiscall
xercesc_4_0::XMLDateTime::getDateCanonicalRepresentation(XMLDateTime *this,MemoryManager *memMgr)

{
  uint uVar1;
  bool bVar2;
  XMLCh *pXVar3;
  MemoryManager *pMVar4;
  int iVar5;
  int iVar6;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  div_t dVar7;
  undefined4 extraout_var_01;
  int iVar8;
  uint uVar9;
  uint value;
  uint uVar10;
  XMLCh *local_60;
  int local_58;
  int local_54;
  XMLCh *local_50;
  int local_44;
  XMLDateTime *local_40;
  MemoryManager *local_38;
  XMLCh *__dest;
  
  iVar8 = this->fValue[7];
  uVar10 = (uint)(iVar8 == 0);
  uVar1 = uVar10 ^ 0x11;
  if (this->fTimeZone[1] == 0 && this->fTimeZone[0] == 0) {
    uVar1 = 0xc - uVar10;
  }
  if (memMgr == (MemoryManager *)0x0) {
    memMgr = this->fMemoryManager;
  }
  iVar5 = (*memMgr->_vptr_MemoryManager[3])(memMgr,(ulong)(uVar1 * 2));
  local_60 = (XMLCh *)CONCAT44(extraout_var,iVar5);
  local_50 = local_60;
  if (this->fValue[3] < 0xc) {
    iVar5 = fillYearString(this,&local_60,this->fValue[0]);
    __dest = local_50;
    if (iVar5 != 0) {
      iVar6 = (*memMgr->_vptr_MemoryManager[3])(memMgr,(long)(int)(uVar1 + iVar5) * 2);
      pXVar3 = local_50;
      __dest = (XMLCh *)CONCAT44(extraout_var_00,iVar6);
      memmove(__dest,local_50,(long)iVar5 * 2 + 8);
      local_60 = (XMLCh *)(((long)local_60 - (long)pXVar3) + (long)__dest);
      (*memMgr->_vptr_MemoryManager[4])(memMgr,pXVar3);
    }
    *local_60 = L'-';
    local_60 = local_60 + 1;
    fillString(this,&local_60,this->fValue[1],2);
    *local_60 = L'-';
    local_60 = local_60 + 1;
    fillString(this,&local_60,this->fValue[2],2);
    if (iVar8 == 0) goto LAB_00255d8c;
    if (this->fTimeZone[1] == 0 && this->fTimeZone[0] == 0) {
      *local_60 = L'Z';
      local_60 = local_60 + 1;
      goto LAB_00255d8c;
    }
    *local_60 = L'-';
    local_60 = local_60 + 1;
    fillString(this,&local_60,this->fValue[3],2);
    *local_60 = L':';
    iVar8 = this->fValue[4];
  }
  else {
    local_44 = this->fValue[4];
    local_58 = 0x3c - local_44;
    local_54 = -this->fValue[3] - (uint)(local_44 != 0);
    iVar8 = this->fValue[2] + 1;
    uVar10 = this->fValue[0];
    value = this->fValue[1];
    local_40 = this;
    local_38 = memMgr;
    do {
      if (value < 0xc) {
        iVar5 = 0x1e;
        if ((0xa50U >> (value & 0x1f) & 1) == 0) {
          if (value != 2) goto LAB_00255b4e;
          iVar5 = 0x1c;
          if ((uVar10 & 3) == 0) {
            uVar9 = uVar10 * -0x3d70a3d7 + 0x51eb850;
            iVar5 = 0x1d;
            if ((uVar9 >> 2 | uVar10 * 0x40000000) < 0x28f5c29) {
              iVar5 = ((uVar9 >> 4 | uVar10 * -0x70000000) < 0xa3d70b) + 0x1c;
            }
          }
        }
      }
      else {
LAB_00255b4e:
        iVar5 = 0x1f;
      }
      if (iVar8 < 1) {
        if (value < 0xd) {
          iVar5 = 0x1e;
          if ((0x14a0U >> (value & 0x1f) & 1) == 0) {
            if (value != 3) goto LAB_00255ba4;
            iVar5 = 0x1c;
            if ((uVar10 & 3) == 0) {
              uVar9 = uVar10 * -0x3d70a3d7 + 0x51eb850;
              iVar5 = 0x1d;
              if ((uVar9 >> 2 | uVar10 * 0x40000000) < 0x28f5c29) {
                iVar5 = ((uVar9 >> 4 | uVar10 * -0x70000000) < 0xa3d70b) + 0x1c;
              }
            }
          }
        }
        else {
LAB_00255ba4:
          iVar5 = 0x1f;
        }
        iVar8 = iVar5 + iVar8;
        iVar6 = -1;
LAB_00255ab6:
        dVar7 = div(iVar6 + value + -1,0xc);
        uVar9 = iVar6 + value + dVar7.quot * -0xc;
        value = uVar9 + 0xc;
        if (0 < (int)uVar9) {
          value = uVar9;
        }
        uVar10 = (uVar10 + dVar7.quot) - (uint)((int)uVar9 < 1);
        bVar2 = true;
      }
      else {
        if (iVar8 - iVar5 != 0 && iVar5 <= iVar8) {
          iVar6 = 1;
          iVar8 = iVar8 - iVar5;
          goto LAB_00255ab6;
        }
        bVar2 = false;
      }
    } while (bVar2);
    if (local_44 == 0) {
      local_58 = 0;
    }
    local_54 = local_54 + 0x18;
    iVar5 = fillYearString(local_40,&local_60,uVar10);
    pMVar4 = local_38;
    __dest = local_50;
    if (iVar5 != 0) {
      iVar6 = (*local_38->_vptr_MemoryManager[3])(local_38,(long)(int)(uVar1 + iVar5) * 2);
      pXVar3 = local_50;
      __dest = (XMLCh *)CONCAT44(extraout_var_01,iVar6);
      memmove(__dest,local_50,(long)iVar5 * 2 + 8);
      local_60 = (XMLCh *)(((long)local_60 - (long)pXVar3) + (long)__dest);
      (*pMVar4->_vptr_MemoryManager[4])(pMVar4,pXVar3);
    }
    this = local_40;
    *local_60 = L'-';
    local_60 = local_60 + 1;
    fillString(local_40,&local_60,value,2);
    *local_60 = L'-';
    local_60 = local_60 + 1;
    fillString(this,&local_60,iVar8,2);
    *local_60 = L'+';
    local_60 = local_60 + 1;
    fillString(this,&local_60,local_54,2);
    *local_60 = L':';
    iVar8 = local_58;
  }
  local_60 = local_60 + 1;
  fillString(this,&local_60,iVar8,2);
LAB_00255d8c:
  *local_60 = L'\0';
  return __dest;
}

Assistant:

XMLCh* XMLDateTime::getDateCanonicalRepresentation(MemoryManager* const memMgr) const
{
    /*
     * Case Date               Actual Value    Canonical Value
     *    1 yyyy-mm-dd         yyyy-mm-dd          yyyy-mm-dd
     *    2 yyyy-mm-ddZ        yyyy-mm-ddT00:00Z   yyyy-mm-ddZ
     *    3 yyyy-mm-dd+00:00   yyyy-mm-ddT00:00Z   yyyy-mm-ddZ
     *    4 yyyy-mm-dd+00:01   YYYY-MM-DCT23:59Z   yyyy-mm-dd+00:01
     *    5 yyyy-mm-dd+12:00   YYYY-MM-DCT12:00Z   yyyy-mm-dd+12:00
     *    6 yyyy-mm-dd+12:01   YYYY-MM-DCT11:59Z   YYYY-MM-DC-11:59
     *    7 yyyy-mm-dd+14:00   YYYY-MM-DCT10:00Z   YYYY-MM-DC-10:00
     *    8 yyyy-mm-dd-00:00   yyyy-mm-ddT00:00Z   yyyy-mm-ddZ
     *    9 yyyy-mm-dd-00:01   yyyy-mm-ddT00:01Z   yyyy-mm-dd-00:01
     *   11 yyyy-mm-dd-11:59   yyyy-mm-ddT11:59Z   YYYY-MM-DD-11:59
     *   10 yyyy-mm-dd-12:00   yyyy-mm-ddT12:00Z   YYYY-MM-DD+12:00
     *   12 yyyy-mm-dd-14:00   yyyy-mm-ddT14:00Z   YYYY-MM-DD+10:00
     */
    int utcSize = (fValue[utc] == UTC_UNKNOWN) ? 0 : 1;
    // YYYY-MM-DD  + chNull
    // 1234567890  + 1
    int memLength = 10 + 1 + utcSize;

    if (fTimeZone[hh] != 0 || fTimeZone[mm] != 0) {
        // YYYY-MM-DD+HH:MM  (utcSize will be 1 so drop that)
        // 1234567890123456
        memLength += 5; // 6 - 1 for utcSize
    }

    MemoryManager* toUse = memMgr? memMgr : fMemoryManager;
    XMLCh* retBuf = (XMLCh*) toUse->allocate( (memLength) * sizeof(XMLCh));
    XMLCh* retPtr = retBuf;

    if (fValue[Hour] < 12) {

        int additionalLen = fillYearString(retPtr, fValue[CentYear]);
        if (additionalLen != 0) {
            // very bad luck; have to resize the buffer...
            XMLCh *tmpBuf = (XMLCh*) toUse->allocate( (additionalLen + memLength ) * sizeof(XMLCh));
            XMLString::moveChars(tmpBuf, retBuf, 4+additionalLen);
            retPtr = tmpBuf+(retPtr-retBuf);
            toUse->deallocate(retBuf);
            retBuf = tmpBuf;
        }
        *retPtr++ = DATE_SEPARATOR;
        fillString(retPtr, fValue[Month], 2);
        *retPtr++ = DATE_SEPARATOR;
        fillString(retPtr, fValue[Day], 2);

        if (utcSize) {
            if (fTimeZone[hh] != 0 || fTimeZone[mm] != 0) {
                *retPtr++ = UTC_NEG_CHAR;
                fillString(retPtr, fValue[Hour], 2);
                *retPtr++ = TIME_SEPARATOR;
                fillString(retPtr, fValue[Minute], 2);
            }
            else {
                *retPtr++ = UTC_STD_CHAR;
            }
        }
        *retPtr = chNull;
    }
    else {
        /*
         * Need to reconvert things to get a recoverable time zone between
         * +12:00 and -11:59
         */
        int carry;
        int minute;
        int hour;
        int day;
        int month;
        int year;
        if (fValue[Minute] == 0) {
            minute = 0;
            carry = 0;
        }
        else {
            minute = 60 - fValue[Minute];
            carry = 1;
        }
        hour  = 24 - fValue[Hour] - carry;
        day   = fValue[Day] + 1;
        month = fValue[Month];
        year  = fValue[CentYear];

        while (1) {
            int temp = maxDayInMonthFor(year, month);
            if (day < 1) {
                day += maxDayInMonthFor(year, month - 1);
                carry = -1;
            }
            else if (day > temp) {
                day -= temp;
                carry = 1;
            }
            else {
                break;
            }

            temp = month + carry;
            month = modulo(temp, 1, 13);
            if (month <= 0) {
                month+= 12;
                year--;
            }
            year += fQuotient(temp, 1, 13);
        }

        int additionalLen = fillYearString(retPtr, year);
        if (additionalLen != 0) {
            // very bad luck; have to resize the buffer...
            XMLCh *tmpBuf = (XMLCh*) toUse->allocate( (additionalLen + memLength ) * sizeof(XMLCh));
            XMLString::moveChars(tmpBuf, retBuf, 4+additionalLen);
            retPtr = tmpBuf+(retPtr-retBuf);
            toUse->deallocate(retBuf);
            retBuf = tmpBuf;
        }
        *retPtr++ = DATE_SEPARATOR;
        fillString(retPtr, month, 2);
        *retPtr++ = DATE_SEPARATOR;
        fillString(retPtr, day, 2);

        *retPtr++ = UTC_POS_CHAR;
        fillString(retPtr, hour, 2);
        *retPtr++ = TIME_SEPARATOR;
        fillString(retPtr, minute, 2);
        *retPtr = chNull;
    }
    return retBuf;
}